

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sq.c
# Opt level: O1

int getargs(HSQUIRRELVM v,int argc,char **argv,SQInteger *retval)

{
  byte bVar1;
  bool bVar2;
  long lVar3;
  char *pcVar4;
  char *pcVar5;
  uint uVar6;
  uint uVar7;
  byte bVar8;
  int iVar9;
  SQChar *err;
  undefined8 local_38;
  
  *retval = 0;
  if (1 < argc) {
    uVar7 = 1;
    bVar2 = false;
    pcVar4 = (char *)0x0;
    do {
      pcVar5 = argv[(int)uVar7];
      if (*pcVar5 != '-') {
        lVar3 = sqstd_loadfile(v,pcVar5,1);
        if (!bVar2) {
          if (lVar3 < 0) goto LAB_001027a1;
          sq_pushroottable(v);
          iVar9 = 1;
          if ((int)(uVar7 + 1) < argc) {
            lVar3 = 0;
            do {
              sq_pushstring(v,argv[(int)(uVar7 + 1) + lVar3],0xffffffffffffffff);
              lVar3 = lVar3 + 1;
            } while (~uVar7 + argc != (int)lVar3);
            iVar9 = argc - uVar7;
          }
          lVar3 = sq_call(v,iVar9,1,1);
          if (lVar3 < 0) {
LAB_00102846:
            pcVar4 = (char *)0x3;
          }
          else {
            iVar9 = sq_gettype(v,0xffffffffffffffff);
            pcVar4 = (char *)0x2;
            if (iVar9 == 0x5000002) {
              *retval = 0x5000002;
              sq_getinteger(v,0xffffffffffffffff);
            }
          }
LAB_0010284b:
          bVar8 = 0;
          goto LAB_0010284e;
        }
        if (-1 < lVar3) {
          pcVar5 = "out.cnut";
          if (pcVar4 != (char *)0x0) {
            pcVar5 = pcVar4;
          }
          lVar3 = sqstd_writeclosuretofile(v,pcVar5);
          if (-1 < lVar3) {
LAB_001026ec:
            pcVar4 = (char *)0x2;
            goto LAB_0010284b;
          }
        }
LAB_001027a1:
        sq_getlasterror(v);
        lVar3 = sq_getstring(v,0xffffffffffffffff,&local_38);
        bVar1 = (byte)((ulong)lVar3 >> 0x38);
        bVar8 = bVar1 >> 7;
        bVar1 = bVar1 >> 7;
        if (lVar3 < 0) {
LAB_00102823:
          bVar8 = bVar1;
          pcVar4 = (char *)0x2;
        }
        else {
          printf("Error [%s]\n",local_38);
          *retval = -2;
          pcVar4 = (char *)0x3;
        }
        goto LAB_0010284e;
      }
      bVar1 = pcVar5[1];
      if (bVar1 < 0x68) {
        uVar6 = uVar7;
        if (bVar1 == 99) {
          bVar2 = true;
          goto LAB_001026a0;
        }
        if (bVar1 != 100) {
LAB_00102839:
          getargs_cold_2();
          goto LAB_00102846;
        }
        sq_enabledebuginfo(v,1);
      }
      else {
        if (bVar1 != 0x6f) {
          if (bVar1 != 0x76) {
            if (bVar1 == 0x68) {
              getargs_cold_1();
              goto LAB_001026ec;
            }
            goto LAB_00102839;
          }
          fprintf(_stdout,"%s %s (%d bits)\n","Squirrel 3.1 stable",
                  "Copyright (C) 2003-2017 Alberto Demichelis",0x40);
          bVar1 = 0;
          goto LAB_00102823;
        }
        uVar6 = uVar7 + 1;
        pcVar4 = argv[(long)(int)uVar7 + 1];
      }
LAB_001026a0:
      uVar7 = uVar6 + 1;
    } while ((int)uVar7 < argc);
    bVar8 = 1;
LAB_0010284e:
    if (bVar8 == 0) {
      return (int)pcVar4;
    }
  }
  return 0;
}

Assistant:

int getargs(HSQUIRRELVM v,int argc, char* argv[],SQInteger *retval)
{
    int i;
    int compiles_only = 0;
#ifdef SQUNICODE
    static SQChar temp[500];
#endif
    char * output = NULL;
    *retval = 0;
    if(argc>1)
    {
        int arg=1,exitloop=0;

        while(arg < argc && !exitloop)
        {

            if(argv[arg][0]=='-')
            {
                switch(argv[arg][1])
                {
                case 'd': //DEBUG(debug infos)
                    sq_enabledebuginfo(v,1);
                    break;
                case 'c':
                    compiles_only = 1;
                    break;
                case 'o':
                    if(arg < argc) {
                        arg++;
                        output = argv[arg];
                    }
                    break;
                case 'v':
                    PrintVersionInfos();
                    return _DONE;

                case 'h':
                    PrintVersionInfos();
                    PrintUsage();
                    return _DONE;
                default:
                    PrintVersionInfos();
                    scprintf(_SC("unknown prameter '-%c'\n"),argv[arg][1]);
                    PrintUsage();
                    *retval = -1;
                    return _ERROR;
                }
            }else break;
            arg++;
        }

        // src file

        if(arg<argc) {
            const SQChar *filename=NULL;
#ifdef SQUNICODE
            mbstowcs(temp,argv[arg],strlen(argv[arg]));
            filename=temp;
#else
            filename=argv[arg];
#endif

            arg++;

            //sq_pushstring(v,_SC("ARGS"),-1);
            //sq_newarray(v,0);

            //sq_createslot(v,-3);
            //sq_pop(v,1);
            if(compiles_only) {
                if(SQ_SUCCEEDED(sqstd_loadfile(v,filename,SQTrue))){
                    const SQChar *outfile = _SC("out.cnut");
                    if(output) {
#ifdef SQUNICODE
                        int len = (int)(strlen(output)+1);
                        mbstowcs(sq_getscratchpad(v,len*sizeof(SQChar)),output,len);
                        outfile = sq_getscratchpad(v,-1);
#else
                        outfile = output;
#endif
                    }
                    if(SQ_SUCCEEDED(sqstd_writeclosuretofile(v,outfile)))
                        return _DONE;
                }
            }
            else {
                //if(SQ_SUCCEEDED(sqstd_dofile(v,filename,SQFalse,SQTrue))) {
                    //return _DONE;
                //}
                if(SQ_SUCCEEDED(sqstd_loadfile(v,filename,SQTrue))) {
                    int callargs = 1;
                    sq_pushroottable(v);
                    for(i=arg;i<argc;i++)
                    {
                        const SQChar *a;
#ifdef SQUNICODE
                        int alen=(int)strlen(argv[i]);
                        a=sq_getscratchpad(v,(int)(alen*sizeof(SQChar)));
                        mbstowcs(sq_getscratchpad(v,-1),argv[i],alen);
                        sq_getscratchpad(v,-1)[alen] = _SC('\0');
#else
                        a=argv[i];
#endif
                        sq_pushstring(v,a,-1);
                        callargs++;
                        //sq_arrayappend(v,-2);
                    }
                    if(SQ_SUCCEEDED(sq_call(v,callargs,SQTrue,SQTrue))) {
                        SQObjectType type = sq_gettype(v,-1);
                        if(type == OT_INTEGER) {
                            *retval = type;
                            sq_getinteger(v,-1,retval);
                        }
                        return _DONE;
                    }
                    else{
                        return _ERROR;
                    }

                }
            }
            //if this point is reached an error occurred
            {
                const SQChar *err;
                sq_getlasterror(v);
                if(SQ_SUCCEEDED(sq_getstring(v,-1,&err))) {
                    scprintf(_SC("Error [%s]\n"),err);
                    *retval = -2;
                    return _ERROR;
                }
            }

        }
    }

    return _INTERACTIVE;
}